

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O1

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint8_t *value;
  uint8_t uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  board_info_area.area.format_version = '\x01';
  board_info_area.area.language_code = '\x19';
  board_info_area.area.mfg_date_time[0] = '\0';
  board_info_area.area.mfg_date_time[1] = '\0';
  board_info_area.area.mfg_date_time[2] = '\0';
  value = info->Handles[0].b + (ulong)info->ContainedHndls * 2;
  uVar5 = info->Manufacturer;
  puVar6 = value;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar3 + 1;
    }
  }
  puVar7 = board_info_area.pad;
  if (puVar6 == (uint8_t *)0x0) {
    board_info_area.area.variable_part[0] = 0xc0;
  }
  else {
    sVar3 = strlen((char *)puVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    board_info_area.area.variable_part[0] = (char)iVar2 + 0xc0;
    if (iVar2 != 0) {
      memcpy(board_info_area.pad,puVar6,(long)iVar2);
      puVar7 = board_info_area.pad + iVar2;
    }
  }
  uVar5 = info->Product;
  puVar6 = value;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar3 + 1;
    }
  }
  if (puVar6 == (uint8_t *)0x0) {
    *puVar7 = 0xc0;
    puVar7 = puVar7 + 1;
  }
  else {
    sVar3 = strlen((char *)puVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar7 = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 1;
    if (iVar2 != 0) {
      memcpy(puVar7,puVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  uVar5 = info->SerialNumber;
  puVar6 = value;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar3 + 1;
    }
  }
  if (puVar6 == (uint8_t *)0x0) {
    *puVar7 = 0xc0;
    puVar7 = puVar7 + 1;
  }
  else {
    sVar3 = strlen((char *)puVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar7 = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 1;
    if (iVar2 != 0) {
      memcpy(puVar7,puVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  puVar7[0] = 0xc0;
  puVar7[1] = 0xc0;
  uVar5 = info->Version;
  puVar6 = value;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar3 + 1;
    }
  }
  puVar7 = puVar7 + 2;
  if (puVar6 != (uint8_t *)0x0) {
    puVar7 = IpmiFruAddCustomString(puVar7,"VERSION",(char *)puVar6);
  }
  uVar5 = info->Location;
  puVar6 = value;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar3 + 1;
    }
  }
  if (puVar6 != (uint8_t *)0x0) {
    puVar7 = IpmiFruAddCustomString(puVar7,"LOCATION",(char *)puVar6);
  }
  uVar5 = info->AssetTag;
  if (uVar5 == '\0') {
    value = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)value);
      value = value + sVar3 + 1;
    }
  }
  if (value != (uint8_t *)0x0) {
    puVar7 = IpmiFruAddCustomString(puVar7,"ASSET_TAG",(char *)value);
  }
  board_info_area_size = IpmiFruFinalizeArea((uint8_t *)&board_info_area,(int)puVar7 - 0x105974);
  return;
}

Assistant:

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)
{
    board_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    board_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    board_info_area.area.mfg_date_time[0] = 0;
    board_info_area.area.mfg_date_time[1] = 0;
    board_info_area.area.mfg_date_time[2] = 0;
    uint8_t *varp = board_info_area.area.variable_part;

    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->Product, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Part number - not specified
    *varp++ = 0xC0;
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Version as custom string
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddCustomString(varp, "VERSION", str);
    }
    //  Location as custom string
    if (str = GetSmbiosString(info->Location, strstart)) {
        varp = IpmiFruAddCustomString(varp, "LOCATION", str);
    }
    //  Asset tag as custom string
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        varp = IpmiFruAddCustomString(varp, "ASSET_TAG", str);
    }
    uint8_t *board_area_ptr = (uint8_t *)&board_info_area;
    board_info_area_size = IpmiFruFinalizeArea(board_area_ptr, varp-board_area_ptr);
}